

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isoent_tree(archive_write *a,isoent **isoentpp)

{
  archive_string *as;
  char cVar1;
  iso9660_conflict *iso9660;
  isoent *child;
  size_t sVar2;
  isoent *parent;
  isofile *piVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  mode_t mVar7;
  isoent *piVar8;
  char *pcVar9;
  char *in_RDX;
  char *extraout_RDX;
  char *fn;
  char *fn_00;
  ulong uVar10;
  char *pcVar11;
  isofile *piVar12;
  char name [256];
  archive_string local_158;
  char local_138 [264];
  
  iso9660 = (iso9660_conflict *)a->format_data;
  child = *isoentpp;
  sVar2 = (child->file->parentdir).length;
  if (sVar2 == 0) {
    pcVar9 = "";
  }
  else {
    pcVar9 = (child->file->parentdir).s;
  }
  parent = (iso9660->primary).rootent;
  as = &iso9660->cur_dirstr;
  if (((iso9660->cur_dirstr).length == sVar2) &&
     (iVar4 = strcmp(as->s,pcVar9), in_RDX = extraout_RDX, iVar4 == 0)) {
    iVar4 = isoent_add_child_tail(iso9660->cur_dirent,child);
    if (iVar4 != 0) {
      return 0;
    }
    parent = iso9660->cur_dirent;
    pcVar9 = (child->file->basename).s;
  }
  else {
    uVar5 = get_path_component(local_138,(size_t)pcVar9,in_RDX);
    uVar10 = 0;
    pcVar11 = pcVar9;
    while (uVar5 != 0) {
      if ((int)uVar5 < 0) {
        archive_set_error(&a->archive,-1,"A name buffer is too small");
        _isoent_free(child);
        return -0x1e;
      }
      piVar8 = (isoent *)__archive_rb_tree_find_node(&parent->rbtree,local_138);
      if (piVar8 == (isoent *)0x0) {
        uVar10 = (ulong)uVar5;
        break;
      }
      if (*pcVar11 == '\0') goto LAB_004c157c;
      if ((piVar8->field_0xe8 & 2) == 0) {
        pcVar9 = archive_entry_pathname(piVar8->file->entry);
        pcVar11 = archive_entry_pathname(child->file->entry);
        archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar9,
                          pcVar11);
        goto LAB_004c15e7;
      }
      pcVar11 = pcVar11 + (ulong)(pcVar11[uVar5] == '/') + (ulong)uVar5;
      uVar5 = get_path_component(local_138,(size_t)pcVar11,fn);
      parent = piVar8;
    }
    cVar1 = *pcVar11;
    while (cVar1 != '\0') {
      local_158.s = (char *)0x0;
      local_158.length = 0;
      local_158.buffer_length = 0;
      archive_strncat(&local_158,pcVar9,(size_t)(pcVar11 + (uVar10 - (long)pcVar9)));
      if (local_158.s[local_158.length - 1] == '/') {
        local_158.s[local_158.length - 1] = '\0';
        local_158.length = local_158.length - 1;
      }
      piVar8 = isoent_create_virtual_dir(a,iso9660,local_158.s);
      archive_string_free(&local_158);
      if (piVar8 == (isoent *)0x0) {
        pcVar9 = "Can\'t allocate memory";
        iVar4 = 0xc;
LAB_004c14cf:
        archive_set_error(&a->archive,iVar4,pcVar9);
        _isoent_free(child);
        *isoentpp = (isoent *)0x0;
        return -0x1e;
      }
      iVar4 = piVar8->file->dircnt;
      if (iso9660->dircnt_max < iVar4) {
        iso9660->dircnt_max = iVar4;
      }
      isoent_add_child_tail(parent,piVar8);
      pcVar11 = pcVar11 + (pcVar11[uVar10] == '/') + uVar10;
      uVar5 = get_path_component(local_138,(size_t)pcVar11,fn_00);
      if ((int)uVar5 < 0) {
        archive_string_free(&local_158);
        pcVar9 = "A name buffer is too small";
        iVar4 = -1;
        goto LAB_004c14cf;
      }
      uVar10 = (ulong)uVar5;
      parent = piVar8;
      cVar1 = *pcVar11;
    }
    iso9660->cur_dirent = parent;
    (iso9660->cur_dirstr).length = 0;
    archive_string_ensure(as,(parent->file->parentdir).length + (parent->file->basename).length + 2)
    ;
    piVar12 = parent->file;
    sVar2 = (piVar12->parentdir).length;
    if ((piVar12->basename).length + sVar2 == 0) {
      *as->s = '\0';
    }
    else {
      if (sVar2 != 0) {
        (iso9660->cur_dirstr).length = 0;
        archive_string_concat(as,&piVar12->parentdir);
        archive_strappend_char(as,'/');
        piVar12 = parent->file;
      }
      archive_string_concat(as,&piVar12->basename);
    }
    iVar4 = isoent_add_child_tail(parent,child);
    if (iVar4 != 0) {
      return 0;
    }
    pcVar9 = (child->file->basename).s;
  }
  piVar8 = (isoent *)__archive_rb_tree_find_node(&parent->rbtree,pcVar9);
LAB_004c157c:
  piVar12 = piVar8->file;
  piVar3 = child->file;
  mVar6 = archive_entry_filetype(piVar12->entry);
  mVar7 = archive_entry_filetype(piVar3->entry);
  if (mVar6 == mVar7) {
    piVar8->file = piVar3;
    child->file = piVar12;
    piVar8->field_0xe8 = piVar8->field_0xe8 & 0xfe;
    _isoent_free(child);
    *isoentpp = piVar8;
    return 0;
  }
  pcVar9 = archive_entry_pathname(piVar12->entry);
  archive_set_error(&a->archive,-1,"Found duplicate entries `%s\' and its file type is different",
                    pcVar9);
LAB_004c15e7:
  _isoent_free(child);
  *isoentpp = (isoent *)0x0;
  return -0x19;
}

Assistant:

static int
isoent_tree(struct archive_write *a, struct isoent **isoentpp)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *dent, *isoent, *np;
	struct isofile *f1, *f2;
	const char *fn, *p;
	int l;

	isoent = *isoentpp;
	dent = iso9660->primary.rootent;
	if (isoent->file->parentdir.length > 0)
		fn = p = isoent->file->parentdir.s;
	else
		fn = p = "";

	/*
	 * If the path of the parent directory of `isoent' entry is
	 * the same as the path of `cur_dirent', add isoent to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(iso9660->cur_dirstr))
	      == archive_strlen(&(isoent->file->parentdir)) &&
	    strcmp(iso9660->cur_dirstr.s, fn) == 0) {
		if (!isoent_add_child_tail(iso9660->cur_dirent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(iso9660->cur_dirent->rbtree),
			    isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			_isoent_free(isoent);
			return (ARCHIVE_FATAL);
		}

		np = isoent_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next subdirectory. */
		if (!np->dir) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    archive_entry_pathname(np->file->entry),
			    archive_entry_pathname(isoent->file->entry));
			_isoent_free(isoent);
			*isoentpp = NULL;
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct isoent *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			vp = isoent_create_virtual_dir(a, iso9660, as.s);
			if (vp == NULL) {
				archive_string_free(&as);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			archive_string_free(&as);

			if (vp->file->dircnt > iso9660->dircnt_max)
				iso9660->dircnt_max = vp->file->dircnt;
			isoent_add_child_tail(dent, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where isoent can be
		 * inserted. */
		iso9660->cur_dirent = dent;
		archive_string_empty(&(iso9660->cur_dirstr));
		archive_string_ensure(&(iso9660->cur_dirstr),
		    archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) + 2);
		if (archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) == 0)
			iso9660->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->file->parentdir)) > 0) {
				archive_string_copy(&(iso9660->cur_dirstr),
				    &(dent->file->parentdir));
				archive_strappend_char(&(iso9660->cur_dirstr), '/');
			}
			archive_string_concat(&(iso9660->cur_dirstr),
			    &(dent->file->basename));
		}

		if (!isoent_add_child_tail(dent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(dent->rbtree), isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	f1 = np->file;
	f2 = isoent->file;

	/* If the file type of entries is different,
	 * we cannot handle it. */
	if (archive_entry_filetype(f1->entry) !=
	    archive_entry_filetype(f2->entry)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found duplicate entries `%s' and its file type is "
		    "different",
		    archive_entry_pathname(f1->entry));
		_isoent_free(isoent);
		*isoentpp = NULL;
		return (ARCHIVE_FAILED);
	}

	/* Swap file entries. */
	np->file = f2;
	isoent->file = f1;
	np->virtual = 0;

	_isoent_free(isoent);
	*isoentpp = np;
	return (ARCHIVE_OK);
}